

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O3

Bit32s MT32Emu::calcTargetPitchOffsetWithoutLFO
                 (PartialParam *partialParam,int levelIndex,uint velocity)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = (partialParam->pitchEnv).veloSensitivity;
  if (bVar1 == 0) {
    uVar2 = 0x5555;
  }
  else {
    if (bVar1 < 4) {
      uVar2 = 0x7f - velocity << (bVar1 + 5 & 0x1f);
    }
    else {
      uVar2 = (0x7f - velocity) * 0x100 >> (3 - bVar1 & 0x1f);
    }
    uVar2 = (0x8000 - uVar2) * 0x5555 >> 0xf;
  }
  return (int)(((partialParam->pitchEnv).level[levelIndex] - 0x32) * uVar2) >>
         (0x10 - (partialParam->pitchEnv).depth & 0x1f);
}

Assistant:

static Bit32s calcTargetPitchOffsetWithoutLFO(const TimbreParam::PartialParam *partialParam, int levelIndex, unsigned int velocity) {
	int veloMult = calcVeloMult(partialParam->pitchEnv.veloSensitivity, velocity);
	int targetPitchOffsetWithoutLFO = partialParam->pitchEnv.level[levelIndex] - 50;
	targetPitchOffsetWithoutLFO = (targetPitchOffsetWithoutLFO * veloMult) >> (16 - partialParam->pitchEnv.depth); // PORTABILITY NOTE: Assumes arithmetic shift
	return targetPitchOffsetWithoutLFO;
}